

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDEdge * __thiscall ON_SubDHeap::AllocateEdgeAndSetId(ON_SubDHeap *this,uint candidate_edge_id)

{
  ON_SubDEdge *pOVar1;
  ON_SubDComponentBase *c;
  ON_SubDComponentBase *unused_list;
  ON_SubDHeap *pOStack_10;
  uint candidate_edge_id_local;
  ON_SubDHeap *this_local;
  
  c = &this->m_unused_edge->super_ON_SubDComponentBase;
  unused_list._4_4_ = candidate_edge_id;
  pOStack_10 = this;
  pOVar1 = (ON_SubDEdge *)
           Internal_AllocateComponentAndSetId
                     (&this->m_fspe,&c,&this->m_max_edge_id,candidate_edge_id);
  this->m_unused_edge = (ON_SubDEdge *)c;
  return pOVar1;
}

Assistant:

class ON_SubDEdge* ON_SubDHeap::AllocateEdgeAndSetId(
  unsigned int candidate_edge_id
  )
{
  ON_SubDComponentBase* unused_list = m_unused_edge;
  ON_SubDComponentBase* c = ON_SubDHeap::Internal_AllocateComponentAndSetId(
    m_fspe,
    unused_list,
    m_max_edge_id,
    candidate_edge_id
  );
  m_unused_edge = static_cast<ON_SubDEdge*>(unused_list);
  return static_cast<ON_SubDEdge*>(c);
}